

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O3

GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> * __thiscall
rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::operator=
          (GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this,
          GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *rhs)

{
  Data local_28;
  
  if (this != rhs) {
    local_28.n.i = (rhs->data_).n;
    local_28.s.str = (rhs->data_).s.str;
    (rhs->data_).f.flags = 0;
    ~GenericValue(this);
    (this->data_).n = local_28.n;
    (this->data_).s.str = local_28.s.str;
    local_28.s.str = (Ch *)((ulong)local_28.s.str & 0xffffffffffff);
    ~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)&local_28.s);
  }
  return this;
}

Assistant:

GenericValue& operator=(GenericValue& rhs) RAPIDJSON_NOEXCEPT {
        if (RAPIDJSON_LIKELY(this != &rhs)) {
            // Can't destroy "this" before assigning "rhs", otherwise "rhs"
            // could be used after free if it's an sub-Value of "this",
            // hence the temporary danse.
            GenericValue temp;
            temp.RawAssign(rhs);
            this->~GenericValue();
            RawAssign(temp);
        }
        return *this;
    }